

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_Minify(char *json)

{
  int iVar1;
  char *local_18;
  char *into;
  char *json_local;
  
  local_18 = json;
  into = json;
  if (json != (char *)0x0) {
    while (*into != '\0') {
      iVar1 = (int)*into;
      if (((iVar1 - 9U < 2) || (iVar1 == 0xd)) || (iVar1 == 0x20)) {
        into = into + 1;
      }
      else if (iVar1 == 0x22) {
        minify_string(&into,&local_18);
      }
      else if (iVar1 == 0x2f) {
        if (into[1] == '/') {
          skip_oneline_comment(&into);
        }
        else if (into[1] == '*') {
          skip_multiline_comment(&into);
        }
      }
      else {
        *local_18 = *into;
        into = into + 1;
        local_18 = local_18 + 1;
      }
    }
    *local_18 = '\0';
  }
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_Minify(char *json)
{
    char *into = json;

    if (json == NULL)
    {
        return;
    }

    while (json[0] != '\0')
    {
        switch (json[0])
        {
            case ' ':
            case '\t':
            case '\r':
            case '\n':
                json++;
                break;

            case '/':
                if (json[1] == '/')
                {
                    skip_oneline_comment(&json);
                }
                else if (json[1] == '*')
                {
                    skip_multiline_comment(&json);
                }
                break;

            case '\"':
                minify_string(&json, (char**)&into);
                break;

            default:
                into[0] = json[0];
                json++;
                into++;
        }
    }

    /* and null-terminate. */
    *into = '\0';
}